

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matras.cc
# Opt level: O2

void matras_alloc_test(void)

{
  matras_id_t mVar1;
  void *pvVar2;
  iterator iVar3;
  long lVar4;
  void *pvVar5;
  char *pcVar6;
  matras_id_t mVar7;
  int iVar8;
  int iVar9;
  matras_id_t mVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  bool bVar14;
  undefined8 uStackY_b0;
  undefined1 local_98 [8];
  matras mat;
  void *pvStack_38;
  uint res;
  void *data;
  
  mat.stats._0_4_ = 1;
  plan(1);
  _space(_stdout);
  mVar10 = 0;
  printf("# *** %s ***\n","matras_alloc_test");
  alloc_err_inj_enabled = false;
  do {
    if (mVar10 == 0x101) {
      iVar12 = 0;
      goto LAB_0010360c;
    }
    matras_create((matras *)local_98,0x10,&pta_allocator,(matras_stats *)0x0);
    if (mat._40_8_ != 0x100) {
      pcVar6 = "mat.capacity == maxCapacity";
      uStackY_b0 = 0x3f;
      goto LAB_00103a26;
    }
    std::
    _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>::
    clear(&AllocatedItems._M_t);
    for (mVar7 = 0; mVar10 != mVar7; mVar7 = mVar7 + 1) {
      mat.stats._4_4_ = 0;
      pvStack_38 = matras_alloc((matras *)local_98,(matras_id_t *)((long)&mat.stats + 4));
      if (pvStack_38 == (void *)0x0) {
        pcVar6 = "data != NULL";
        uStackY_b0 = 0x44;
        goto LAB_00103a26;
      }
      pvVar2 = matras_get((matras *)local_98,mat.stats._4_4_);
      if (pvStack_38 != pvVar2) {
        pcVar6 = "data == test_data";
        uStackY_b0 = 0x46;
        goto LAB_00103a26;
      }
      mVar1 = matras_extent_count((matras *)local_98);
      if ((AllocatedCount & 0x3ffffffffffffff) != (ulong)mVar1) {
        pcVar6 = "provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE";
        uStackY_b0 = 0x48;
        goto LAB_00103a26;
      }
      if (mVar7 != mat.stats._4_4_) {
        pcVar6 = "res == j";
        uStackY_b0 = 0x49;
        goto LAB_00103a26;
      }
      if (AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        pcVar6 = "!AllocatedBlocks.empty()";
        uStackY_b0 = 0x4b;
        goto LAB_00103a26;
      }
      iVar3 = std::
              _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
              ::lower_bound(&AllocatedBlocks._M_t,&stack0xffffffffffffffc8);
      if (((_Rb_tree_header *)iVar3._M_node == &AllocatedBlocks._M_t._M_impl.super__Rb_tree_header)
         || (pvVar2 = *(void **)(iVar3._M_node + 1), pvVar5 = pvVar2, pvVar2 != pvStack_38)) {
        if (iVar3._M_node == AllocatedBlocks._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
          pcVar6 = "itr != AllocatedBlocks.begin()";
          uStackY_b0 = 0x4e;
          goto LAB_00103a26;
        }
        lVar4 = std::_Rb_tree_decrement(iVar3._M_node);
        if (lVar4 == 0x10a148) {
          pcVar6 = "itr != AllocatedBlocks.end()";
          uStackY_b0 = 0x51;
          goto LAB_00103a26;
        }
        pvVar2 = *(void **)(lVar4 + 0x20);
        pvVar5 = pvStack_38;
      }
      if ((void *)((long)pvVar2 + 0x30) < pvVar5) {
        pcVar6 = "data <= (void*)( ((char*)(*itr)) + PROV_EXTENT_SIZE - PROV_BLOCK_SIZE)";
        uStackY_b0 = 0x52;
        goto LAB_00103a26;
      }
      if (AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
        iVar3 = std::
                _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>
                ::lower_bound(&AllocatedItems._M_t,&stack0xffffffffffffffc8);
        if (((_Rb_tree_header *)iVar3._M_node != &AllocatedItems._M_t._M_impl.super__Rb_tree_header)
           && (*(ulong *)(iVar3._M_node + 1) < (long)pvStack_38 + 0x10U)) {
          pcVar6 = "*itr >= (void*)(((char*)data) + PROV_BLOCK_SIZE)";
          uStackY_b0 = 0x58;
          goto LAB_00103a26;
        }
        if ((iVar3._M_node != AllocatedItems._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
           && (lVar4 = std::_Rb_tree_decrement(iVar3._M_node),
              pvStack_38 < (void *)(*(long *)(lVar4 + 0x20) + 0x10))) {
          pcVar6 = "data >= (void*)(((char*)(*itr)) + PROV_BLOCK_SIZE)";
          uStackY_b0 = 0x5c;
          goto LAB_00103a26;
        }
      }
      std::_Rb_tree<void*,void*,std::_Identity<void*>,std::less<void*>,std::allocator<void*>>::
      _M_insert_unique<void*const&>
                ((_Rb_tree<void*,void*,std::_Identity<void*>,std::less<void*>,std::allocator<void*>>
                  *)&AllocatedItems,&stack0xffffffffffffffc8);
    }
    mVar7 = matras_extent_count((matras *)local_98);
    if ((AllocatedCount & 0x3ffffffffffffff) != (ulong)mVar7) {
      pcVar6 = "provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE";
      uStackY_b0 = 99;
      goto LAB_00103a26;
    }
    matras_destroy((matras *)local_98);
    mVar10 = mVar10 + 1;
  } while (AllocatedCount == 0);
  pcVar6 = "AllocatedCount == 0";
  uStackY_b0 = 0x65;
  goto LAB_00103a26;
LAB_0010360c:
  if (iVar12 == 0x101) goto LAB_0010369e;
  matras_create((matras *)local_98,0x10,&pta_allocator,(matras_stats *)0x0);
  iVar8 = iVar12;
  while (bVar14 = iVar8 != 0, iVar8 = iVar8 + -1, iVar9 = (int)mat.stats, bVar14) {
    pvStack_38 = (void *)((ulong)pvStack_38 & 0xffffffff00000000);
    matras_alloc((matras *)local_98,(matras_id_t *)&stack0xffffffffffffffc8);
  }
  while (iVar9 + -1 != 0) {
    matras_dealloc((matras *)local_98);
    mVar10 = matras_extent_count((matras *)local_98);
    iVar9 = iVar9 + -1;
    if ((AllocatedCount & 0x3ffffffffffffff) != (ulong)mVar10) {
      pcVar6 = "provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE";
      uStackY_b0 = 0x71;
      goto LAB_00103a26;
    }
  }
  if (AllocatedCount != 0) {
    pcVar6 = "AllocatedCount == 0";
    uStackY_b0 = 0x73;
    goto LAB_00103a26;
  }
  matras_destroy((matras *)local_98);
  iVar12 = iVar12 + 1;
  mat.stats._0_4_ = (int)mat.stats + 1;
  goto LAB_0010360c;
LAB_0010369e:
  alloc_err_inj_enabled = true;
  uVar11 = 0;
  do {
    if (uVar11 == 0x101) {
      alloc_err_inj_enabled = false;
      _ok(1,"true",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",0x8b,
          "line %d",0x8b);
      _space(_stdout);
      printf("# *** %s: done ***\n","matras_alloc_test");
      check_plan();
      return;
    }
    matras_create((matras *)local_98,0x10,&pta_allocator,(matras_stats *)0x0);
    iVar12 = 0x100;
    alloc_err_inj_countdown = uVar11;
    do {
      bVar14 = iVar12 == 0;
      iVar12 = iVar12 + -1;
      if (bVar14) goto LAB_0010370d;
      pvStack_38 = (void *)((ulong)pvStack_38 & 0xffffffff00000000);
      uVar13 = (ulong)(uint)mat.head.root;
      pvVar2 = matras_alloc((matras *)local_98,(matras_id_t *)&stack0xffffffffffffffc8);
    } while (pvVar2 != (void *)0x0);
    if (uVar13 != CONCAT44(mat.head.root._4_4_,(uint)mat.head.root)) {
      pcVar6 = "prev_block_count == mat.head.block_count";
      uStackY_b0 = 0x82;
      goto LAB_00103a26;
    }
LAB_0010370d:
    matras_destroy((matras *)local_98);
    uVar11 = uVar11 + 1;
  } while (AllocatedCount == 0);
  pcVar6 = "AllocatedCount == 0";
  uStackY_b0 = 0x87;
LAB_00103a26:
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar6,"false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/matras.cc",
          uStackY_b0,"matras_alloc_test");
  exit(-1);
}

Assistant:

void matras_alloc_test()
{
	plan(1);
	header();

	unsigned int maxCapacity =  PROV_EXTENT_SIZE / PROV_BLOCK_SIZE;
	maxCapacity *= PROV_EXTENT_SIZE / sizeof(void *);
	maxCapacity *= PROV_EXTENT_SIZE / sizeof(void *);

	struct matras mat;

	alloc_err_inj_enabled = false;
	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
		fail_unless(mat.capacity == maxCapacity);
		AllocatedItems.clear();
		for (unsigned int j = 0; j < i; j++) {
			unsigned int res = 0;
			void *data = matras_alloc(&mat, &res);
			fail_unless(data != NULL);
			void *test_data = matras_get(&mat, res);
			fail_unless(data == test_data);
			size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
			fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
			fail_unless(res == j);
			{
				fail_unless(!AllocatedBlocks.empty());
				std::set<void*>::iterator itr = AllocatedBlocks.lower_bound(data);
				if (itr == AllocatedBlocks.end() || *itr != data) {
					fail_unless(itr != AllocatedBlocks.begin());
					--itr;
				}
				fail_unless(itr != AllocatedBlocks.end());
				fail_unless(data <= (void*)( ((char*)(*itr)) + PROV_EXTENT_SIZE - PROV_BLOCK_SIZE));
			}
			{
				if (!AllocatedItems.empty()) {
					std::set<void*>::iterator itr = AllocatedItems.lower_bound(data);
					if (itr != AllocatedItems.end()) {
						fail_unless(*itr >= (void*)(((char*)data) + PROV_BLOCK_SIZE));
					}
					if (itr != AllocatedItems.begin()) {
						--itr;
						fail_unless(data >= (void*)(((char*)(*itr)) + PROV_BLOCK_SIZE));
					}
				}
			}
			AllocatedItems.insert(data);
		}
		size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
		fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
		matras_destroy(&mat);
		fail_unless(AllocatedCount == 0);
	}

	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);
		for (unsigned int j = 0; j < i; j++) {
			unsigned int res = 0;
			(void) matras_alloc(&mat, &res);
		}
		for (unsigned int j = 0; j < i; j++) {
			matras_dealloc(&mat);
			size_t provConsumedMemory = (size_t)matras_extent_count(&mat) * PROV_EXTENT_SIZE;
			fail_unless(provConsumedMemory == AllocatedCount * PROV_EXTENT_SIZE);
		}
		fail_unless(AllocatedCount == 0);
		matras_destroy(&mat);
	}

	alloc_err_inj_enabled = true;
	for (unsigned int i = 0; i <= maxCapacity; i++) {
		matras_create(&mat, PROV_BLOCK_SIZE, &pta_allocator, NULL);

		alloc_err_inj_countdown = i;

		for (unsigned int j = 0; j < maxCapacity; j++) {
			unsigned int res = 0;
			unsigned int prev_block_count = mat.head.block_count;
			void *data = matras_alloc(&mat, &res);
			if (!data) {
				fail_unless(prev_block_count == mat.head.block_count);
				break;
			}
		}
		matras_destroy(&mat);
		fail_unless(AllocatedCount == 0);
	}

	alloc_err_inj_enabled = false;
	ok(true);

	footer();
	check_plan();
}